

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O0

void just_test_test_case_f_test_can_create_files_in_temp_dir(void)

{
  directory *this;
  byte bVar1;
  string *__lhs;
  undefined8 uVar2;
  allocator<char> local_2a1;
  string local_2a0;
  assert_msg local_280;
  undefined1 local_258 [8];
  ofstream f;
  undefined1 local_48 [8];
  string p;
  directory d;
  
  this = (directory *)((long)&p.field_2 + 8);
  just::temp::directory::directory(this);
  __lhs = just::temp::directory::path_abi_cxx11_(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,__lhs
                 ,"/test.txt");
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_258,uVar2,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/temp/test/test_dir.cpp"
             ,&local_2a1);
  just::test::assert_msg::assert_msg(&local_280,&local_2a0,0x4b);
  bVar1 = std::ios::fail();
  just::test::assert_msg::operator()(&local_280,(bool)(~bVar1 & 1));
  just::test::assert_msg::~assert_msg(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::ofstream::~ofstream(local_258);
  std::__cxx11::string::~string((string *)local_48);
  just::temp::directory::~directory((directory *)((long)&p.field_2 + 8));
  return;
}

Assistant:

JUST_TEST_CASE(test_can_create_files_in_temp_dir)
{
  const temp::directory d;

  const std::string p = d.path() + "/test.txt";
  std::ofstream f(p.c_str());

  JUST_ASSERT(!f.fail());
}